

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture.h
# Opt level: O1

void __thiscall server::captureservmode::regenowners(captureservmode *this,baseinfo *b,int ticks)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  
  if (0 < DAT_00194834) {
    lVar8 = 0;
    do {
      lVar1 = *(long *)(clients + lVar8 * 8);
      if ((((*(int *)(lVar1 + 0x3c4) == 0) && (*(char *)(lVar1 + 0x124) != '\0')) &&
          (iVar3 = strcmp((char *)(lVar1 + 0x124),b->owner), iVar3 == 0)) &&
         ((fVar9 = (b->o).field_0.field_0.x - *(float *)(lVar1 + 0x3b8),
          fVar10 = (b->o).field_0.field_0.y - *(float *)(lVar1 + 0x3bc),
          fVar9 * fVar9 + fVar10 * fVar10 <= 4096.0 &&
          (ABS((b->o).field_0.field_0.z - *(float *)(lVar1 + 0x3c0)) <= 24.0)))) {
        iVar3 = *(int *)(lVar1 + 0x354);
        if (*(int *)(lVar1 + 0x350) < iVar3) {
          iVar4 = *(int *)(lVar1 + 0x350) + ticks * 10;
          if (iVar3 <= iVar4) {
            iVar4 = iVar3;
          }
          *(int *)(lVar1 + 0x350) = iVar4;
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
        if (*(int *)(lVar1 + 0x35c) == 1) {
          if (*(int *)(lVar1 + 0x358) < 100) goto LAB_001492a5;
        }
        else {
          *(undefined8 *)(lVar1 + 0x358) = 0x100000000;
LAB_001492a5:
          iVar3 = *(int *)(lVar1 + 0x358) + ticks * 10;
          if (99 < iVar3) {
            iVar3 = 100;
          }
          *(int *)(lVar1 + 0x358) = iVar3;
          bVar2 = true;
        }
        lVar5 = (long)b->ammotype;
        uVar6 = b->ammotype - 1;
        if ((uVar6 < 6) &&
           (iVar3 = *(int *)(lVar1 + 0x36c + lVar5 * 4),
           iVar3 < *(int *)((long)&PTR_flush_00182520 + lVar5 * 0x20 + 4))) {
          iVar3 = (itemstats[uVar6].add * ticks * 0x14) / 100 + iVar3;
          if (itemstats[uVar6].max <= iVar3) {
            iVar3 = itemstats[uVar6].max;
          }
          *(int *)(lVar1 + 0x36c + lVar5 * 4) = iVar3;
          bVar2 = true;
        }
        if (bVar2) {
          uVar6 = b->ammotype;
          uVar7 = 0;
          if (uVar6 - 1 < 6) {
            uVar7 = (ulong)*(uint *)(lVar1 + 0x36c + (ulong)uVar6 * 4);
          }
          sendf(-1,1,"ri6",0x45,(ulong)*(uint *)(lVar1 + 8),(ulong)*(uint *)(lVar1 + 0x350),
                (ulong)*(uint *)(lVar1 + 0x358),(ulong)uVar6,uVar7);
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < DAT_00194834);
  }
  return;
}

Assistant:

loopv(clients)
        {
            clientinfo *ci = clients[i];
            if(ci->state.state==CS_ALIVE && ci->team[0] && !strcmp(ci->team, b.owner) && insidebase(b, ci->state.o))
            {
                bool notify = false;
                if(ci->state.health < ci->state.maxhealth)
                {
                    ci->state.health = min(ci->state.health + ticks*REGENHEALTH, ci->state.maxhealth);
                    notify = true;
                }
                if(ci->state.armourtype != A_GREEN || ci->state.armour < itemstats[I_GREENARMOUR-I_SHELLS].max)
                {
                    if(ci->state.armourtype != A_GREEN)
                    {
                        ci->state.armourtype = A_GREEN;
                        ci->state.armour = 0;
                    }
                    ci->state.armour = min(ci->state.armour + ticks*REGENARMOUR, itemstats[I_GREENARMOUR-I_SHELLS].max);
                    notify = true;
                }
                if(b.valid())
                {
                    int ammotype = b.ammotype-1+I_SHELLS;
                    if(!ci->state.hasmaxammo(ammotype))
                    {
                        ci->state.addammo(b.ammotype, ticks*REGENAMMO, 100);
                        notify = true;
                    }
                }
                if(notify)
                    sendf(-1, 1, "ri6", N_BASEREGEN, ci->clientnum, ci->state.health, ci->state.armour, b.ammotype, b.valid() ? ci->state.ammo[b.ammotype] : 0);
            }
        }